

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O3

bool cmFileTimes::Copy(string *fromFile,string *toFile)

{
  _Head_base<0UL,_cmFileTimes::Times_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  _Head_base<0UL,_cmFileTimes::Times_*,_false> local_20;
  
  local_20._M_head_impl = (Times *)0x0;
  bVar2 = Load((cmFileTimes *)&local_20,fromFile);
  _Var1._M_head_impl = local_20._M_head_impl;
  if (bVar2) {
    if ((utimbuf *)local_20._M_head_impl == (utimbuf *)0x0) {
      return false;
    }
    iVar3 = utime((toFile->_M_dataplus)._M_p,(utimbuf *)local_20._M_head_impl);
    bVar2 = -1 < iVar3;
  }
  else {
    bVar2 = false;
    if ((utimbuf *)local_20._M_head_impl == (utimbuf *)0x0) {
      return false;
    }
  }
  operator_delete(_Var1._M_head_impl,0x10);
  return bVar2;
}

Assistant:

bool cmFileTimes::Copy(std::string const& fromFile, std::string const& toFile)
{
  cmFileTimes fileTimes;
  return (fileTimes.Load(fromFile) && fileTimes.Store(toFile));
}